

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltextureglyphcache_p.h
# Opt level: O0

void __thiscall
QOpenGLGlyphTexture::QOpenGLGlyphTexture(QOpenGLGlyphTexture *this,QOpenGLContext *ctx)

{
  QOpenGLContextGroup *pQVar1;
  QOpenGLContextPrivate *pQVar2;
  QOpenGLContext *in_RSI;
  QOpenGLSharedResource *in_RDI;
  long in_FS_OFFSET;
  GLsizei n;
  QOpenGLFunctions local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QOpenGLContextGroup *)QOpenGLContext::shareGroup();
  QOpenGLSharedResource::QOpenGLSharedResource(in_RDI,pQVar1);
  *(undefined ***)in_RDI = &PTR__QOpenGLGlyphTexture_00214278;
  *(undefined4 *)(in_RDI + 0x18) = 0;
  *(undefined4 *)(in_RDI + 0x1c) = 0;
  pQVar2 = QOpenGLContext::d_func((QOpenGLContext *)0x1a5199);
  n = (GLsizei)((ulong)in_RDI >> 0x20);
  if (((byte)pQVar2[0xfc] & 1) == 0) {
    QOpenGLFunctions::QOpenGLFunctions(local_10,in_RSI);
    QOpenGLFunctions::glGenFramebuffers((QOpenGLFunctions *)in_RSI,n,(GLuint *)0x1a51c8);
    QOpenGLFunctions::~QOpenGLFunctions(local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit QOpenGLGlyphTexture(QOpenGLContext *ctx)
        : QOpenGLSharedResource(ctx->shareGroup())
        , m_width(0)
        , m_height(0)
    {
        if (!ctx->d_func()->workaround_brokenFBOReadBack)
            QOpenGLFunctions(ctx).glGenFramebuffers(1, &m_fbo);

#ifdef QT_GL_TEXTURE_GLYPH_CACHE_DEBUG
        qDebug(" -> QOpenGLGlyphTexture() %p for context %p.", this, ctx);
#endif
    }